

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torus_refinement_demo.cc
# Opt level: O0

int main(int argc,char **argv)

{
  unsigned_long uVar1;
  initializer_list<double> __l;
  pointer argv_00;
  uint uVar2;
  options_description_easy_init *poVar3;
  typed_value<unsigned_long,_char> *ptVar4;
  typed_value<unsigned_int,_char> *ptVar5;
  typed_value<std::vector<double,_std::allocator<double>_>,_char> *ptVar6;
  size_type sVar7;
  ostream *poVar8;
  variable_value *pvVar9;
  unsigned_long *puVar10;
  uint *puVar11;
  vector<double,_std::allocator<double>_> *__x;
  element_type *peVar12;
  string local_7c8;
  allocator<char> local_7a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  shared_ptr<const_lf::mesh::Mesh> local_740;
  undefined1 local_730 [8];
  VtkWriter vtk_writer;
  allocator<char> local_531;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  shared_ptr<const_lf::mesh::Mesh> mesh_fine;
  int local_4a8;
  size_type_conflict n_levels;
  int step;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_498;
  undefined1 local_490 [8];
  MeshHierarchy multi_mesh;
  Mesh *mesh;
  shared_ptr<lf::mesh::Mesh> mesh_ptr;
  Matrix<double,_2,_1,_0,_2,_1> local_3b8;
  double local_3a8;
  double local_3a0;
  Matrix<double,_2,_1,_0,_2,_1> local_398;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_380;
  undefined1 local_378 [8];
  TorusMeshBuilder builder;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_328;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  mesh_factory_ptr;
  string local_318;
  undefined1 local_2f8 [8];
  vector<double,_std::allocator<double>_> top_right_corner_coords;
  string local_2d8;
  uint local_2b8;
  allocator<char> local_2b1;
  size_type_conflict num_y_cells;
  uint local_290;
  allocator<char> local_289;
  size_type_conflict num_x_cells;
  unsigned_long local_268;
  size_t num_steps;
  key_type local_258;
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_238;
  basic_parsed_options<char> local_218;
  undefined1 local_1f0 [8];
  variables_map vm;
  string local_148;
  allocator<double> local_121;
  double local_120 [2];
  iterator local_110;
  size_type local_108;
  vector<double,_std::allocator<double>_> local_100;
  uint local_e8 [2];
  unsigned_long local_e0;
  options_description_easy_init local_d8 [3];
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  options_description desc;
  char **argv_local;
  int argc_local;
  
  desc.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Allowed options",&local_b9);
  boost::program_options::options_description::options_description
            ((options_description *)local_98,&local_b8,0x50,0x28);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options
                          ((options_description *)local_98);
  poVar3 = boost::program_options::options_description_easy_init::operator()
                     (local_d8,"help","Produce this help message");
  ptVar4 = boost::program_options::value<unsigned_long>();
  local_e0 = 4;
  ptVar4 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar4,&local_e0)
  ;
  poVar3 = boost::program_options::options_description_easy_init::operator()
                     (poVar3,"num_steps",(value_semantic *)ptVar4,
                      "Number of uniform refinement steps");
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_e8[1] = 4;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar5,local_e8 + 1);
  poVar3 = boost::program_options::options_description_easy_init::operator()
                     (poVar3,"num_x_cells",(value_semantic *)ptVar5,"Number of cells in x direction"
                     );
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_e8[0] = 4;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value(ptVar5,local_e8);
  poVar3 = boost::program_options::options_description_easy_init::operator()
                     (poVar3,"num_y_cells",(value_semantic *)ptVar5,"Number of cells in y direction"
                     );
  ptVar6 = boost::program_options::value<std::vector<double,std::allocator<double>>>();
  ptVar6 = boost::program_options::typed_value<std::vector<double,_std::allocator<double>_>,_char>::
           multitoken(ptVar6);
  local_120[0] = 1.0;
  local_120[1] = 4.0;
  local_110 = local_120;
  local_108 = 2;
  std::allocator<double>::allocator(&local_121);
  __l._M_len = local_108;
  __l._M_array = local_110;
  std::vector<double,_std::allocator<double>_>::vector(&local_100,__l,&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"1., 4.",
             (allocator<char> *)
             ((long)&vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  ptVar6 = boost::program_options::typed_value<std::vector<double,_std::allocator<double>_>,_char>::
           default_value(ptVar6,&local_100,&local_148);
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"top_right_corner",(value_semantic *)ptVar6,
             "Coordinates of top right corner of rectangle with bottom left at (0,0)");
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&vm.m_required._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::vector<double,_std::allocator<double>_>::~vector(&local_100);
  std::allocator<double>::~allocator(&local_121);
  boost::program_options::variables_map::variables_map((variables_map *)local_1f0);
  argv_00 = desc.groups.
            super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_238.super_function_base.functor._8_8_ = 0;
  local_238.super_function_base.functor._16_8_ = 0;
  local_238.super_function_base.vtable = (vtable_base *)0x0;
  local_238.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function_n(&local_238);
  boost::program_options::parse_command_line<char>
            (&local_218,argc,(char **)argv_00,(options_description *)local_98,0,&local_238);
  boost::program_options::store(&local_218,(variables_map *)local_1f0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_218);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_238);
  boost::program_options::notify((variables_map *)local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"help",(allocator<char> *)((long)&num_steps + 7));
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&vm.super_abstract_variables_map.m_next,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&num_steps + 7));
  if (sVar7 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&num_x_cells,"num_steps",&local_289);
    pvVar9 = boost::program_options::variables_map::operator[]
                       ((variables_map *)local_1f0,(string *)&num_x_cells);
    puVar10 = boost::program_options::variable_value::as<unsigned_long>(pvVar9);
    uVar1 = *puVar10;
    std::__cxx11::string::~string((string *)&num_x_cells);
    std::allocator<char>::~allocator(&local_289);
    local_268 = uVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&num_y_cells,"num_x_cells",&local_2b1);
    pvVar9 = boost::program_options::variables_map::operator[]
                       ((variables_map *)local_1f0,(string *)&num_y_cells);
    puVar11 = boost::program_options::variable_value::as<unsigned_int>(pvVar9);
    uVar2 = *puVar11;
    std::__cxx11::string::~string((string *)&num_y_cells);
    std::allocator<char>::~allocator(&local_2b1);
    local_290 = uVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"num_y_cells",
               (allocator<char> *)
               ((long)&top_right_corner_coords.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pvVar9 = boost::program_options::variables_map::operator[]
                       ((variables_map *)local_1f0,&local_2d8);
    puVar11 = boost::program_options::variable_value::as<unsigned_int>(pvVar9);
    uVar2 = *puVar11;
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&top_right_corner_coords.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_2b8 = uVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"top_right_corner",
               (allocator<char> *)
               ((long)&mesh_factory_ptr._M_t.
                       super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                       .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl
               + 7));
    pvVar9 = boost::program_options::variables_map::operator[]
                       ((variables_map *)local_1f0,&local_318);
    __x = boost::program_options::variable_value::as<std::vector<double,std::allocator<double>>>
                    (pvVar9);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_2f8,__x);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&mesh_factory_ptr._M_t.
                       super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                       .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl
               + 7));
    std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_328);
    std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
              ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
               &local_380,&local_328);
    lf::mesh::utils::TorusMeshBuilder::TorusMeshBuilder((TorusMeshBuilder *)local_378,&local_380);
    std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
              (&local_380);
    local_3a0 = 0.0;
    local_3a8 = 0.0;
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
              ((Matrix<double,2,1,0,2,1> *)&local_398,&local_3a0,&local_3a8);
    lf::mesh::utils::StructuredMeshBuilder::setBottomLeftCorner<Eigen::Matrix<double,2,1,0,2,1>>
              ((StructuredMeshBuilder *)local_378,&local_398);
    mesh_ptr.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)local_2f8);
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<double*>
              ((Matrix<double,2,1,0,2,1> *)&local_3b8,
               (double **)
               &mesh_ptr.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    lf::mesh::utils::StructuredMeshBuilder::setTopRightCorner<Eigen::Matrix<double,2,1,0,2,1>>
              ((StructuredMeshBuilder *)local_378,&local_3b8);
    lf::mesh::utils::StructuredMeshBuilder::setNumXCells
              ((StructuredMeshBuilder *)local_378,local_290);
    lf::mesh::utils::StructuredMeshBuilder::setNumYCells
              ((StructuredMeshBuilder *)local_378,local_2b8);
    lf::mesh::utils::TorusMeshBuilder::Build((TorusMeshBuilder *)&mesh);
    multi_mesh.refinement_edges_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&mesh);
    lf::mesh::utils::PrintInfo
              ((ostream *)&std::cout,
               (Mesh *)multi_mesh.refinement_edges_.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0xb);
    std::operator<<((ostream *)&std::cout,'\n');
    std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>(&step);
    std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
              ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
               &local_498,
               (unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                *)&step);
    lf::refinement::MeshHierarchy::MeshHierarchy
              ((MeshHierarchy *)local_490,(shared_ptr<lf::mesh::Mesh> *)&mesh,&local_498);
    std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
              (&local_498);
    std::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
    ::~unique_ptr((unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                   *)&step);
    for (local_4a8 = 0; (ulong)(long)local_4a8 < local_268; local_4a8 = local_4a8 + 1) {
      mesh_fine.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = lf::refinement::MeshHierarchy::NumLevels((MeshHierarchy *)local_490);
      lf::refinement::MeshHierarchy::getMesh((MeshHierarchy *)local_4d0,(size_type)local_490);
      std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
                ((shared_ptr<lf::mesh::Mesh_const> *)local_4c0,
                 (shared_ptr<lf::mesh::Mesh> *)local_4d0);
      std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)local_4d0);
      poVar8 = std::operator<<((ostream *)&std::cout,"Mesh on level ");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,mesh_fine.
                                 super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_ - 1);
      poVar8 = std::operator<<(poVar8,": ");
      peVar12 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_4c0);
      uVar2 = (*peVar12->_vptr_Mesh[3])(peVar12,2);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar2);
      poVar8 = std::operator<<(poVar8," nodes, ");
      peVar12 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_4c0);
      uVar2 = (*peVar12->_vptr_Mesh[3])(peVar12,1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar2);
      poVar8 = std::operator<<(poVar8," edges, ");
      peVar12 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_4c0);
      uVar2 = (*peVar12->_vptr_Mesh[3])(peVar12,0);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar2);
      poVar8 = std::operator<<(poVar8," cells,");
      std::operator<<(poVar8,'\n');
      peVar12 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_4c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_530,"torus_refinement",&local_531);
      std::__cxx11::to_string((string *)&vtk_writer.aux_node_offset_._M_elems[1].codim_,local_4a8);
      std::operator+(&local_510,&local_530,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vtk_writer.aux_node_offset_._M_elems[1].codim_);
      std::operator+(&local_4f0,&local_510,".csv");
      lf::io::writeMatplotlib(peVar12,&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&vtk_writer.aux_node_offset_._M_elems[1].codim_);
      std::__cxx11::string::~string((string *)&local_530);
      std::allocator<char>::~allocator(&local_531);
      std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
                (&local_740,(shared_ptr<const_lf::mesh::Mesh> *)local_4c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,"torus_refinement",&local_7a1);
      std::__cxx11::to_string(&local_7c8,local_4a8);
      std::operator+(&local_780,&local_7a0,&local_7c8);
      std::operator+(&local_760,&local_780,".vtk");
      lf::io::VtkWriter::VtkWriter((VtkWriter *)local_730,&local_740,&local_760,0,'\x01');
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::allocator<char>::~allocator(&local_7a1);
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_740);
      lf::refinement::MeshHierarchy::RefineRegular((MeshHierarchy *)local_490,rp_regular);
      lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_730);
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
                ((shared_ptr<const_lf::mesh::Mesh> *)local_4c0);
    }
    argv_local._4_4_ = 0;
    num_steps._0_4_ = 1;
    lf::refinement::MeshHierarchy::~MeshHierarchy((MeshHierarchy *)local_490);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&mesh);
    lf::mesh::utils::TorusMeshBuilder::~TorusMeshBuilder((TorusMeshBuilder *)local_378);
    std::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
    ::~unique_ptr(&local_328);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_2f8);
  }
  else {
    poVar8 = boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)local_98);
    std::operator<<(poVar8,'\n');
    argv_local._4_4_ = 1;
    num_steps._0_4_ = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_1f0);
  boost::program_options::options_description::~options_description((options_description *)local_98)
  ;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  // define allowed command line arguments:
  namespace po = boost::program_options;
  po::options_description desc("Allowed options");
  desc.add_options()("help", "Produce this help message")(
      "num_steps", po::value<size_t>()->default_value(4),
      "Number of uniform refinement steps")(
      "num_x_cells", po::value<size_type>()->default_value(4),
      "Number of cells in x direction")(
      "num_y_cells", po::value<size_type>()->default_value(4),
      "Number of cells in y direction")(
      "top_right_corner",
      po::value<std::vector<double>>()->multitoken()->default_value(
          std::vector<double>{1., 4.}, "1., 4."),
      "Coordinates of top right corner of rectangle with bottom left at (0,0)");

  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  po::notify(vm);

  if (vm.count("help") != 0U) {
    std::cout << desc << '\n';
    return 1;
  }

  const size_t num_steps = vm["num_steps"].as<size_t>();
  const size_type num_x_cells = vm["num_x_cells"].as<size_type>();
  const size_type num_y_cells = vm["num_y_cells"].as<size_type>();
  std::vector<double> top_right_corner_coords =
      vm["top_right_corner"].as<std::vector<double>>();

  std::unique_ptr<lf::mesh::hybrid2d::MeshFactory> mesh_factory_ptr =
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(3);

  // build tensor product mesh by specifying rectangle from which torus will
  // be generated by identifying opposite edges
  lf::mesh::utils::TorusMeshBuilder builder(std::move(mesh_factory_ptr));
  builder.setBottomLeftCorner(Eigen::Vector2d{0., 0.});
  builder.setTopRightCorner(Eigen::Vector2d{top_right_corner_coords.data()});
  builder.setNumXCells(num_x_cells);
  builder.setNumYCells(num_y_cells);
  const std::shared_ptr<lf::mesh::Mesh> mesh_ptr = builder.Build();

  // output mesh information
  const lf::mesh::Mesh &mesh = *mesh_ptr;
  lf::mesh::utils::PrintInfo(std::cout, mesh);
  std::cout << '\n';

  // build mesh hierarchy
  lf::refinement::MeshHierarchy multi_mesh(
      mesh_ptr, std::make_unique<lf::mesh::hybrid2d::MeshFactory>(3));

  for (int step = 0; step < num_steps; ++step) {
    // obtain pointer to mesh on finest level
    const size_type n_levels = multi_mesh.NumLevels();
    const std::shared_ptr<const lf::mesh::Mesh> mesh_fine =
        multi_mesh.getMesh(n_levels - 1);

    // print number of entities of various co-dimensions
    std::cout << "Mesh on level " << n_levels - 1 << ": "
              << mesh_fine->NumEntities(2) << " nodes, "
              << mesh_fine->NumEntities(1) << " edges, "
              << mesh_fine->NumEntities(0) << " cells," << '\n';

    lf::io::writeMatplotlib(*mesh_fine, std::string("torus_refinement") +
                                            std::to_string(step) + ".csv");

    const lf::io::VtkWriter vtk_writer(
        mesh_fine,
        std::string("torus_refinement") + std::to_string(step) + ".vtk");

    multi_mesh.RefineRegular();
  }

  return 0;
}